

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProtocol.cpp
# Opt level: O0

void __thiscall mognetwork::protocol::TextProtocol::flushReader(TextProtocol *this)

{
  ReadedDatas *in_RDI;
  ReadedDatas *in_stack_ffffffffffffffa8;
  void *pvVar1;
  
  TcpSocket::ReadedDatas::ReadedDatas((ReadedDatas *)0x116982);
  TcpSocket::ReadedDatas::operator=(in_RDI,in_stack_ffffffffffffffa8);
  TcpSocket::ReadedDatas::~ReadedDatas((ReadedDatas *)0x1169a1);
  if ((*(long *)&in_RDI[1].datas.super__Vector_base<char,_std::allocator<char>_>._M_impl != 0) &&
     (pvVar1 = *(void **)&in_RDI[1].datas.super__Vector_base<char,_std::allocator<char>_>._M_impl,
     pvVar1 != (void *)0x0)) {
    TcpSocket::ReadedDatas::~ReadedDatas((ReadedDatas *)0x1169c9);
    operator_delete(pvVar1);
  }
  *(undefined8 *)&in_RDI[1].datas.super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  return;
}

Assistant:

void TextProtocol::flushReader()
    {
      m_pendingDatas = TcpSocket::ReadedDatas();
      if (m_fullDatas != NULL)
	delete m_fullDatas;
      m_fullDatas = NULL;
    }